

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O1

XMLSize_t __thiscall xercesc_4_0::CMStateSet::hashCode(CMStateSet *this)

{
  CMDynamicBuffer *pCVar1;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  long lVar4;
  
  pCVar1 = this->fDynamicBuffer;
  if (pCVar1 == (CMDynamicBuffer *)0x0) {
    lVar4 = 0;
    XVar2 = 0;
    do {
      XVar2 = XVar2 * 0x1f + (long)this->fBits[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
  }
  else {
    if (pCVar1->fArraySize == 0) {
      return 0;
    }
    XVar3 = 0;
    XVar2 = 0;
    do {
      if (pCVar1->fBitArray[XVar3] == (XMLInt32 *)0x0) {
        lVar4 = 0x20;
        do {
          XVar2 = XVar2 * 0x1f;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      else {
        lVar4 = 0;
        do {
          XVar2 = XVar2 * 0x1f + (long)pCVar1->fBitArray[XVar3][lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x20);
      }
      XVar3 = XVar3 + 1;
    } while (XVar3 != pCVar1->fArraySize);
  }
  return XVar2;
}

Assistant:

XMLSize_t hashCode() const
    {
        XMLSize_t hash = 0;
        if(fDynamicBuffer==0)
        {
            for (XMLSize_t index = 0; index<CMSTATE_CACHED_INT32_SIZE; index++)
                hash = fBits[index] + hash * 31;
        }
        else
        {
            for (XMLSize_t index = 0; index<fDynamicBuffer->fArraySize; index++)
            {
                if(fDynamicBuffer->fBitArray[index]==NULL)
                    // simulates the iteration on the missing bits
                    for(XMLSize_t subIndex=0;subIndex < CMSTATE_BITFIELD_INT32_SIZE; subIndex++)
                        hash *= 31;
                else
                    for(XMLSize_t subIndex=0;subIndex < CMSTATE_BITFIELD_INT32_SIZE; subIndex++)
                        hash = fDynamicBuffer->fBitArray[index][subIndex] + hash * 31;
            }
        }
        return hash;
    }